

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_mident_metrics(Omega_h *this,Mesh *mesh,Int ent_dim,Reals *v2m,bool has_degen)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  allocator local_81;
  Write<double> local_80;
  Write<int> local_70;
  LOs e2e;
  string local_50;
  
  size_in = Mesh::nents(mesh,ent_dim);
  std::__cxx11::string::string((string *)&local_50,"",&local_81);
  Read<int>::Read(&e2e,size_in,0,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Write<int>::Write(&local_70,&e2e.write_);
  Write<double>::Write(&local_80,&v2m->write_);
  get_mident_metrics(this,mesh,ent_dim,(LOs *)&local_70,(Reals *)&local_80,has_degen);
  Write<double>::~Write(&local_80);
  Write<int>::~Write(&local_70);
  Write<int>::~Write(&e2e.write_);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(Mesh* mesh, Int ent_dim, Reals v2m, bool has_degen) {
  LOs e2e(mesh->nents(ent_dim), 0, 1);
  return get_mident_metrics(mesh, ent_dim, e2e, v2m, has_degen);
}